

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageQueue.cpp
# Opt level: O0

void __thiscall f8n::runtime::MessageQueue::Dispatch(MessageQueue *this)

{
  long lVar1;
  EnqueuedMessage *this_00;
  bool bVar2;
  int iVar3;
  rep rVar4;
  element_type *peVar5;
  undefined4 extraout_var;
  size_type sVar6;
  reference ppEVar7;
  bool local_169;
  bool local_159;
  _List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*> local_120;
  _List_node_base *local_118;
  shared_ptr<f8n::runtime::IMessage> local_110;
  _Self local_100;
  _Self local_f8;
  Iterator it;
  _Self local_e0;
  _Self local_d8;
  key_type local_d0;
  IMessageTarget *target;
  EnqueuedMessage *local_b8;
  EnqueuedMessage *m;
  byte local_a1;
  iterator iStack_a0;
  bool done;
  Iterator it_1;
  LockT lock;
  int64_t nextTime;
  duration<long,_std::ratio<1L,_1000000000L>_> local_78;
  duration<long,_std::ratio<1L,_1000L>_> local_70;
  milliseconds now;
  MessageQueue *this_local;
  memory_order __b_2;
  memory_order __b_1;
  memory_order __b;
  
  now.__r = (rep)this;
  nextTime = std::chrono::_V2::system_clock::now();
  local_78.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                                          *)&nextTime);
  local_70.__r = (rep)std::chrono::
                      duration_cast<std::chrono::duration<long,std::ratio<1l,1000l>>,long,std::ratio<1l,1000000000l>>
                                (&local_78);
  std::operator&(memory_order_seq_cst,__memory_order_mask);
  lVar1 = (this->nextMessageTime).super___atomic_base<long>._M_i;
  rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&local_70);
  if ((lVar1 <= rVar4) && (-1 < lVar1)) {
    std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&it_1,&this->queueMutex);
    std::operator&(memory_order_seq_cst,__memory_order_mask);
    LOCK();
    (this->nextMessageTime).super___atomic_base<long>._M_i = -1;
    UNLOCK();
    iStack_a0 = std::__cxx11::
                list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                ::begin(&this->queue);
    local_a1 = 0;
    while( true ) {
      local_159 = false;
      if ((local_a1 & 1) == 0) {
        m = (EnqueuedMessage *)
            std::__cxx11::
            list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
            ::end(&this->queue);
        local_159 = std::operator!=(&stack0xffffffffffffff60,(_Self *)&m);
      }
      if (local_159 == false) break;
      ppEVar7 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                          (&stack0xffffffffffffff60);
      local_b8 = *ppEVar7;
      bVar2 = std::chrono::operator>=(&local_70,&local_b8->time);
      if (bVar2) {
        ppEVar7 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                            (&stack0xffffffffffffff60);
        peVar5 = std::
                 __shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<f8n::runtime::IMessage,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)*ppEVar7);
        iVar3 = (*peVar5->_vptr_IMessage[2])();
        local_d0 = (key_type)CONCAT44(extraout_var,iVar3);
        local_169 = true;
        if (local_d0 != (key_type)0x0) {
          local_d8._M_node =
               (_Base_ptr)
               std::
               set<f8n::runtime::IMessageTarget_*,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
               ::find(&this->targets,&local_d0);
          local_e0._M_node =
               (_Base_ptr)
               std::
               set<f8n::runtime::IMessageTarget_*,_std::less<f8n::runtime::IMessageTarget_*>,_std::allocator<f8n::runtime::IMessageTarget_*>_>
               ::end(&this->targets);
          local_169 = std::operator!=(&local_d8,&local_e0);
        }
        if (local_169 != false) {
          std::__cxx11::
          list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
          ::push_back(&this->dispatch,&local_b8);
        }
        std::_List_const_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::
        _List_const_iterator
                  ((_List_const_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*> *)&it,
                   &stack0xffffffffffffff60);
        iStack_a0 = std::__cxx11::
                    list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
                    ::erase(&this->queue,it._M_node);
      }
      else {
        local_a1 = 1;
      }
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&it_1);
    local_f8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
         ::begin(&this->dispatch);
    while( true ) {
      local_100._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ::end(&this->dispatch);
      bVar2 = std::operator!=(&local_f8,&local_100);
      if (!bVar2) break;
      ppEVar7 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                          (&local_f8);
      std::shared_ptr<f8n::runtime::IMessage>::shared_ptr(&local_110,&(*ppEVar7)->message);
      Dispatch(this,&local_110);
      std::shared_ptr<f8n::runtime::IMessage>::~shared_ptr(&local_110);
      ppEVar7 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                          (&local_f8);
      this_00 = *ppEVar7;
      if (this_00 != (EnqueuedMessage *)0x0) {
        EnqueuedMessage::~EnqueuedMessage(this_00);
        operator_delete(this_00,0x18);
      }
      local_118 = (_List_node_base *)
                  std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator++
                            (&local_f8,0);
    }
    std::__cxx11::
    list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
    ::clear(&this->dispatch);
    sVar6 = std::__cxx11::
            list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
            ::size(&this->queue);
    if (sVar6 != 0) {
      local_120._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<f8n::runtime::MessageQueue::EnqueuedMessage_*,_std::allocator<f8n::runtime::MessageQueue::EnqueuedMessage_*>_>
           ::begin(&this->queue);
      ppEVar7 = std::_List_iterator<f8n::runtime::MessageQueue::EnqueuedMessage_*>::operator*
                          (&local_120);
      rVar4 = std::chrono::duration<long,_std::ratio<1L,_1000L>_>::count(&(*ppEVar7)->time);
      std::operator&(memory_order_seq_cst,__memory_order_mask);
      LOCK();
      (this->nextMessageTime).super___atomic_base<long>._M_i = rVar4;
      UNLOCK();
    }
  }
  return;
}

Assistant:

void MessageQueue::Dispatch() {
    milliseconds now = duration_cast<milliseconds>(
        system_clock::now().time_since_epoch());

    int64_t nextTime = nextMessageTime.load();

    if (nextTime > now.count() || nextTime < 0) {
        return; /* short circuit before any iteration. */
    }

    using Iterator = std::list<EnqueuedMessage*>::iterator;

    {
        LockT lock(this->queueMutex);

        this->nextMessageTime.store(-1);

        Iterator it = this->queue.begin();

        bool done = false;
        while (!done && it != this->queue.end()) {
            /* messages are time-ordered. pop and dispatch one at a time
            until we get to a message that should be delivered in the future,
            or the queue has been exhausted. */

            EnqueuedMessage *m = (*it);

            if (now >= m->time) {
                /* it's possible the target (receiver) has been unregistered;
                if that's the case, just discard it. otherwise, add it to the
                output set to be dispatched outside of the critical section */
                auto const target = (*it)->message->Target();
                if (target == nullptr || this->targets.find(target) != this->targets.end()) {
                    this->dispatch.push_back(m);
                }
                it = this->queue.erase(it);
            }
            else {
                done = true;
            }
        }
    }

    /* dispatch outside of the critical section */

    Iterator it = this->dispatch.begin();
    while (it != this->dispatch.end()) {
        this->Dispatch((*it)->message);
        delete *it;
        it++;
    }

    this->dispatch.clear();

    if (this->queue.size()) {
        this->nextMessageTime.store((*this->queue.begin())->time.count());
    }
}